

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMapInfo.h
# Opt level: O2

bool llvm::DenseMapInfo<llvm::StringRef>::isEqual(StringRef LHS,StringRef RHS)

{
  int iVar1;
  char *__s2;
  size_t __n;
  char *__s1;
  bool bVar2;
  
  __n = LHS.Length;
  __s1 = LHS.Data;
  __s2 = RHS.Data;
  if (__s2 == (char *)0xfffffffffffffffe) {
    bVar2 = __s1 == (char *)0xfffffffffffffffe;
  }
  else {
    if (__s2 != (char *)0xffffffffffffffff) {
      if (__n != RHS.Length) {
        return false;
      }
      if (__n != 0) {
        iVar1 = bcmp(__s1,__s2,__n);
        return iVar1 == 0;
      }
      return true;
    }
    bVar2 = __s1 == (char *)0xffffffffffffffff;
  }
  return bVar2;
}

Assistant:

static bool isEqual(StringRef LHS, StringRef RHS) {
    if (RHS.data() == getEmptyKey().data())
      return LHS.data() == getEmptyKey().data();
    if (RHS.data() == getTombstoneKey().data())
      return LHS.data() == getTombstoneKey().data();
    return LHS == RHS;
  }